

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

char * __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::combine_data<short>
          (hash_combine_recursive_helper *this,size_t *length,char *buffer_ptr,char *buffer_end,
          short data)

{
  bool bVar1;
  hash_state local_70;
  size_t local_38;
  size_t partial_store_size;
  char *pcStack_28;
  short data_local;
  char *buffer_end_local;
  char *buffer_ptr_local;
  size_t *length_local;
  hash_combine_recursive_helper *this_local;
  
  partial_store_size._6_2_ = data;
  pcStack_28 = buffer_end;
  buffer_end_local = buffer_ptr;
  buffer_ptr_local = (char *)length;
  length_local = (size_t *)this;
  bVar1 = store_and_advance<short>
                    (&buffer_end_local,buffer_end,(short *)((long)&partial_store_size + 6),0);
  if (!bVar1) {
    local_38 = (long)pcStack_28 - (long)buffer_end_local;
    memcpy(buffer_end_local,(void *)((long)&partial_store_size + 6),local_38);
    if (*(long *)buffer_ptr_local == 0) {
      hash_state::create(&local_70,this->buffer,this->seed);
      memcpy(&this->state,&local_70,0x38);
      buffer_ptr_local[0] = '@';
      buffer_ptr_local[1] = '\0';
      buffer_ptr_local[2] = '\0';
      buffer_ptr_local[3] = '\0';
      buffer_ptr_local[4] = '\0';
      buffer_ptr_local[5] = '\0';
      buffer_ptr_local[6] = '\0';
      buffer_ptr_local[7] = '\0';
    }
    else {
      hash_state::mix(&this->state,this->buffer);
      *(long *)buffer_ptr_local = *(long *)buffer_ptr_local + 0x40;
    }
    buffer_end_local = this->buffer;
    bVar1 = store_and_advance<short>
                      (&buffer_end_local,pcStack_28,(short *)((long)&partial_store_size + 6),
                       local_38);
    if (!bVar1) {
      abort();
    }
  }
  return buffer_end_local;
}

Assistant:

char *combine_data(size_t &length, char *buffer_ptr, char *buffer_end, T data) {
    if (!store_and_advance(buffer_ptr, buffer_end, data)) {
      // Check for skew which prevents the buffer from being packed, and do
      // a partial store into the buffer to fill it. This is only a concern
      // with the variadic combine because that formation can have varying
      // argument types.
      size_t partial_store_size = buffer_end - buffer_ptr;
      memcpy(buffer_ptr, &data, partial_store_size);

      // If the store fails, our buffer is full and ready to hash. We have to
      // either initialize the hash state (on the first full buffer) or mix
      // this buffer into the existing hash state. Length tracks the *hashed*
      // length, not the buffered length.
      if (length == 0) {
        state = state.create(buffer, seed);
        length = 64;
      } else {
        // Mix this chunk into the current state and bump length up by 64.
        state.mix(buffer);
        length += 64;
      }
      // Reset the buffer_ptr to the head of the buffer for the next chunk of
      // data.
      buffer_ptr = buffer;

      // Try again to store into the buffer -- this cannot fail as we only
      // store types smaller than the buffer.
      if (!store_and_advance(buffer_ptr, buffer_end, data,
                             partial_store_size))
        abort();
    }
    return buffer_ptr;
  }